

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

void __thiscall
nonstd::optional_lite::optional<tinyusdz::Token>::initialize<tinyusdz::Token>
          (optional<tinyusdz::Token> *this,Token *value)

{
  bool bVar1;
  Token *value_local;
  optional<tinyusdz::Token> *this_local;
  
  bVar1 = has_value(this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("! has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                  ,0x5d4,
                  "void nonstd::optional_lite::optional<tinyusdz::Token>::initialize(const V &) [T = tinyusdz::Token, V = tinyusdz::Token]"
                 );
  }
  detail::storage_t<tinyusdz::Token>::construct_value
            ((storage_t<tinyusdz::Token> *)&this->contained,value);
  this->has_value_ = true;
  return;
}

Assistant:

void initialize( V const & value )
    {
        assert( ! has_value()  );
        contained.construct_value( value );
        has_value_ = true;
    }